

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall
tetgenmesh::save_segmentpoint_insradius(tetgenmesh *this,point segpt,point parentpt,double r)

{
  int iVar1;
  face local_38;
  face local_28;
  
  iVar1 = *(int *)((long)parentpt + (long)this->pointmarkindex * 4 + 4) >> 8;
  if (iVar1 == 7) {
    local_28.shver = SUB84(segpt[(long)this->point2simindex + 2],0) & 7;
    local_28.sh = (shellface *)((ulong)segpt[(long)this->point2simindex + 2] & 0xfffffffffffffff8);
    local_38.shver = SUB84(parentpt[(long)this->point2simindex + 2],0) & 7;
    local_38.sh = (shellface *)
                  ((ulong)parentpt[(long)this->point2simindex + 2] & 0xfffffffffffffff8);
    iVar1 = segfacetadjacent(this,&local_28,&local_38);
    if ((iVar1 != 0) && (r * 1.4142135623730951 < parentpt[this->pointinsradiusindex])) {
      r = parentpt[this->pointinsradiusindex] / 1.4142135623730951;
    }
  }
  else if (iVar1 == 6) {
    local_28.shver = SUB84(segpt[(long)this->point2simindex + 2],0) & 7;
    local_28.sh = (shellface *)((ulong)segpt[(long)this->point2simindex + 2] & 0xfffffffffffffff8);
    local_38.shver = SUB84(parentpt[(long)this->point2simindex + 2],0) & 7;
    local_38.sh = (shellface *)
                  ((ulong)parentpt[(long)this->point2simindex + 2] & 0xfffffffffffffff8);
    iVar1 = segsegadjacent(this,&local_28,&local_38);
    if ((iVar1 != 0) && (r < parentpt[this->pointinsradiusindex])) {
      r = parentpt[this->pointinsradiusindex];
    }
  }
  segpt[this->pointinsradiusindex] = r;
  return;
}

Assistant:

void tetgenmesh::save_segmentpoint_insradius(point segpt,point parentpt,REAL r)
{
  REAL rv = r, rp;
  if (pointtype(parentpt) == FREESEGVERTEX) {
    face parentseg1, parentseg2;
    sdecode(point2sh(segpt), parentseg1);
    sdecode(point2sh(parentpt), parentseg2);
    if (segsegadjacent(&parentseg1, &parentseg2)) {
      rp = getpointinsradius(parentpt);
      if (rv < rp) {
        // The relaxed insertion radius of 'newpt'.
        rv = rp; 
      }
    }
  } else if (pointtype(parentpt) == FREEFACETVERTEX) {
    face parentseg, parentsh;
    sdecode(point2sh(segpt), parentseg);
    sdecode(point2sh(parentpt), parentsh);
    if (segfacetadjacent(&parentseg, &parentsh)) {
      rp = getpointinsradius(parentpt);
      if ((sqrt(2.0) * rv) < rp) { // if (rv < rp) {
        // The relaxed insertion radius of 'newpt'.
        rv = rp / sqrt(2.0); // rv = rp; 
      }
    }
  }
  setpointinsradius(segpt, rv);
}